

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

void __thiscall PatternBlock::restoreXml(PatternBlock *this,Element *el)

{
  long lVar1;
  Element *this_00;
  bool bVar2;
  _Ios_Fmtflags _Var3;
  string *psVar4;
  reference ppEVar5;
  allocator local_6f1;
  string local_6f0 [32];
  long local_6d0;
  istringstream s_3;
  allocator local_549;
  string local_548 [32];
  long local_528;
  istringstream s_2;
  Element *subel;
  uint local_398;
  uint local_394;
  uintm val;
  uintm mask;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_388
  ;
  const_iterator iter;
  List *list;
  string local_370 [32];
  long local_350;
  istringstream s_1;
  allocator local_1b9;
  string local_1b8 [32];
  long local_198;
  istringstream s;
  Element *el_local;
  PatternBlock *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"offset",&local_1b9);
  psVar4 = Element::getAttributeValue(el,(string *)local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_198,psVar4,8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  lVar1 = *(long *)(local_198 + -0x18);
  _Var3 = std::operator|(_S_dec,_S_hex);
  _Var3 = std::operator|(_Var3,_S_oct);
  std::ios_base::unsetf((ios_base *)((long)&local_198 + lVar1),_Var3);
  std::istream::operator>>(&local_198,&this->offset);
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"nonzero",(allocator *)((long)&list + 7));
  psVar4 = Element::getAttributeValue(el,(string *)local_370);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_350,psVar4,8);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)((long)&list + 7));
  lVar1 = *(long *)(local_350 + -0x18);
  _Var3 = std::operator|(_S_dec,_S_hex);
  _Var3 = std::operator|(_Var3,_S_oct);
  std::ios_base::unsetf((ios_base *)((long)&local_350 + lVar1),_Var3);
  std::istream::operator>>(&local_350,&this->nonzerosize);
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_350);
  iter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&local_388);
  _val = std::vector<Element_*,_std::allocator<Element_*>_>::begin(iter._M_current);
  local_388._M_current = _val;
  while( true ) {
    subel = (Element *)
            std::vector<Element_*,_std::allocator<Element_*>_>::end
                      ((vector<Element_*,_std::allocator<Element_*>_> *)iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_388,
                       (__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                        *)&subel);
    if (!bVar2) break;
    ppEVar5 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&local_388);
    this_00 = *ppEVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_548,"mask",&local_549);
    psVar4 = Element::getAttributeValue(this_00,(string *)local_548);
    std::__cxx11::istringstream::istringstream((istringstream *)&local_528,psVar4,8);
    std::__cxx11::string::~string(local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    lVar1 = *(long *)(local_528 + -0x18);
    _Var3 = std::operator|(_S_dec,_S_hex);
    _Var3 = std::operator|(_Var3,_S_oct);
    std::ios_base::unsetf((ios_base *)((long)&local_528 + lVar1),_Var3);
    std::istream::operator>>(&local_528,&local_394);
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_528);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6f0,"val",&local_6f1);
    psVar4 = Element::getAttributeValue(this_00,(string *)local_6f0);
    std::__cxx11::istringstream::istringstream((istringstream *)&local_6d0,psVar4,8);
    std::__cxx11::string::~string(local_6f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
    lVar1 = *(long *)(local_6d0 + -0x18);
    _Var3 = std::operator|(_S_dec,_S_hex);
    _Var3 = std::operator|(_Var3,_S_oct);
    std::ios_base::unsetf((ios_base *)((long)&local_6d0 + lVar1),_Var3);
    std::istream::operator>>(&local_6d0,&local_398);
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_6d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->maskvec,&local_394);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->valvec,&local_398);
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(&local_388);
  }
  normalize(this);
  return;
}

Assistant:

void PatternBlock::restoreXml(const Element *el)

{
  {
    istringstream s(el->getAttributeValue("offset"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> offset;
  }
  {
    istringstream s(el->getAttributeValue("nonzero"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> nonzerosize;
  }
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  uintm mask,val;
  while(iter != list.end()) {
    Element *subel = *iter;
    {
      istringstream s(subel->getAttributeValue("mask"));
      s.unsetf(ios::dec | ios::hex | ios::oct);
      s >> mask;
    }
    {
      istringstream s(subel->getAttributeValue("val"));
      s.unsetf(ios::dec | ios::hex | ios::oct);
      s >> val;
    }
    maskvec.push_back(mask);
    valvec.push_back(val);
    ++iter;
  }
  normalize();
}